

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O3

sg_buffer sg_make_buffer(sg_buffer_desc *desc)

{
  undefined4 uVar1;
  sg_buffer sVar2;
  _sg_buffer_t *buf;
  long lVar3;
  sg_buffer_desc *psVar4;
  sg_usage sVar5;
  sg_buffer_desc def;
  sg_buffer_desc local_70;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f02,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  if (desc != (sg_buffer_desc *)0x0) {
    psVar4 = &local_70;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = *(undefined4 *)&desc->field_0x4;
      psVar4->_start_canary = desc->_start_canary;
      *(undefined4 *)&psVar4->field_0x4 = uVar1;
      desc = (sg_buffer_desc *)&desc->size;
      psVar4 = (sg_buffer_desc *)&psVar4->size;
    }
    sVar5 = local_70.usage;
    local_70.type = local_70.type + (uint)(local_70.type == _SG_BUFFERTYPE_DEFAULT);
    local_70.usage = sVar5 + (sVar5 == _SG_USAGE_DEFAULT);
    if (local_70.size == 0) {
      local_70.size = local_70.data.size;
    }
    else if (local_70.data.size == 0) {
      local_70.data.size = local_70.size;
    }
    sVar2 = _sg_alloc_buffer();
    if (sVar2.id == 0) {
      if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
        puts("buffer pool exhausted!");
      }
      else {
        (*_sg.desc.logger.log_cb)("buffer pool exhausted!",_sg.desc.logger.user_data);
      }
    }
    else {
      buf = _sg_buffer_at((_sg_pools_t *)(ulong)sVar2.id,(uint32_t)desc);
      if ((buf == (_sg_buffer_t *)0x0) || ((buf->slot).state != SG_RESOURCESTATE_ALLOC)) {
        __assert_fail("buf && (buf->slot.state == SG_RESOURCESTATE_ALLOC)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                      ,0x3f08,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
      }
      _sg_init_buffer(buf,&local_70);
      if (((buf->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
        __assert_fail("(buf->slot.state == SG_RESOURCESTATE_VALID) || (buf->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                      ,0x3f0a,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
      }
    }
    return (sg_buffer)sVar2.id;
  }
  __assert_fail("desc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                ,0x3f03,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
}

Assistant:

inline sg_buffer sg_make_buffer(const sg_buffer_desc& desc) { return sg_make_buffer(&desc); }